

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::genRfaceids
               (FaceInfo *faces,int nfaces,uint32_t *rfaceids,uint32_t *faceids)

{
  int i;
  ulong uVar1;
  ulong uVar2;
  _Temporary_buffer<unsigned_int_*,_unsigned_int> _Stack_48;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < nfaces) {
    uVar2 = (ulong)(uint)nfaces;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    faceids[uVar1] = (uint32_t)uVar1;
  }
  if (nfaces != 0) {
    std::_Temporary_buffer<unsigned_int_*,_unsigned_int>::_Temporary_buffer
              (&_Stack_48,faceids,((long)nfaces + 1) / 2);
    if (_Stack_48._M_buffer == (uint *)0x0) {
      std::
      __inplace_stable_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>>
                (faceids,faceids + nfaces,
                 (_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>)
                 faces);
    }
    else {
      std::
      __stable_sort_adaptive<unsigned_int*,unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>>
                (faceids,faceids + nfaces,_Stack_48._M_buffer,_Stack_48._M_len,
                 (_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>)
                 faces);
    }
    std::_Temporary_buffer<unsigned_int_*,_unsigned_int>::~_Temporary_buffer(&_Stack_48);
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    rfaceids[faceids[uVar1]] = (uint32_t)uVar1;
  }
  return;
}

Assistant:

void genRfaceids(const FaceInfo* faces, int nfaces,
                 uint32_t* rfaceids, uint32_t* faceids)
{
    // stable_sort faceids by smaller dimension (u or v) in descending order
    // treat const faces as having res of 1

    // init faceids
    for (int i = 0; i < nfaces; i++) faceids[i] = i;

    // sort faceids by rfaceid
    std::stable_sort(faceids, faceids + nfaces, CompareRfaceIds(faces));

    // generate mapping from faceid to rfaceid
    for (int i = 0; i < nfaces; i++) {
        // note: i is the rfaceid
        rfaceids[faceids[i]] = i;
    }
}